

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int type_specifier(sym_t *s)

{
  int iVar1;
  socklen_t *in_RDX;
  socklen_t *__addr_len;
  socklen_t *__addr_len_00;
  sockaddr *in_RSI;
  long in_RDI;
  int local_4;
  
  iVar1 = accept(0x80,in_RSI,in_RDX);
  if (iVar1 == 0) {
    iVar1 = accept(0x84,in_RSI,__addr_len);
    if (iVar1 == 0) {
      iVar1 = accept(0x85,in_RSI,__addr_len_00);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        if (*(int *)(in_RDI + 0x20) == 0) {
          *(undefined4 *)(in_RDI + 0x20) = 0x85;
        }
        else {
          err(E,"two or more data types in declaration specifiers");
        }
        local_4 = 1;
      }
    }
    else {
      if (*(int *)(in_RDI + 0x20) == 0) {
        *(undefined4 *)(in_RDI + 0x20) = 0x84;
      }
      else {
        err(E,"two or more data types in declaration specifiers");
      }
      local_4 = 1;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x20) == 0) {
      *(undefined4 *)(in_RDI + 0x20) = 0x80;
    }
    else {
      err(E,"two or more data types in declaration specifiers");
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int type_specifier(sym_t* s)
{
    if (accept(BYTE))
    {
        if (s->type_id )
            err(E, "two or more data types in declaration specifiers");
        else
            s->type_id = BYTE;
        return 1;
    }
    else if (accept(VOID))
    {
        if (s->type_id)
            err(E, "two or more data types in declaration specifiers");
        else
            s->type_id = VOID;
        return 1;
    }
    else if (accept(WORD))
    {
        if (s->type_id )
            err(E, "two or more data types in declaration specifiers");
        else
            s->type_id = WORD;
        return 1;
    }

    return 0;
}